

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void writeint(char *outfile,int a)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uchar b [4];
  
  lVar1 = noutmax;
  for (uVar2 = 3; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    b[uVar2] = (uchar)a;
    a = a >> 8;
  }
  lVar3 = noutchar;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    if (lVar3 < lVar1) {
      outfile[lVar3] = b[lVar4];
      lVar3 = lVar3 + 1;
      noutchar = lVar3;
    }
  }
  return;
}

Assistant:

static void
writeint(char *outfile, int a)
{
int i;
unsigned char b[4];

	/* Write integer A one byte at a time to outfile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 */
	for (i=3; i>=0; i--) {
		b[i] = a & 0x000000ff;
		a >>= 8;
	}
	for (i=0; i<4; i++) qwrite(outfile, (char *) &b[i],1);
}